

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularString::
GenerateNonInlineAccessorDefinitions(SingularString *this,Printer *p)

{
  if (*(long *)(*(long *)((this->super_FieldGeneratorBase).field_ + 0x50) + 8) != 0) {
    google::protobuf::io::Printer::Emit
              (p,0,0,0x97,
               "\n      /*static*/ const ::_pbi::LazyString $Msg$::$default_variable_field${\n          {{$kDefault$, $kDefaultLen$}},\n          {nullptr},\n      };\n    "
              );
    return;
  }
  return;
}

Assistant:

void GenerateNonInlineAccessorDefinitions(io::Printer* p) const override {
    if (EmptyDefault()) return;
    p->Emit(R"cc(
      /*static*/ const ::_pbi::LazyString $Msg$::$default_variable_field${
          {{$kDefault$, $kDefaultLen$}},
          {nullptr},
      };
    )cc");
  }